

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharpyuv_gamma.c
# Opt level: O0

float ToLinearSmpte240(float gamma)

{
  float in_XMM0_Da;
  undefined4 local_4;
  
  if (0.0 <= in_XMM0_Da) {
    if (0.09128634 <= in_XMM0_Da) {
      if (1.0 <= in_XMM0_Da) {
        local_4 = 1.0;
      }
      else {
        local_4 = Powf(0.0,3.019749e-39);
      }
    }
    else {
      local_4 = in_XMM0_Da / 4.0;
    }
  }
  else {
    local_4 = 0.0;
  }
  return local_4;
}

Assistant:

static float ToLinearSmpte240(float gamma) {
  if (gamma < 0.f) {
    return 0.f;
  } else if (gamma < 4.f * 0.022821585529445f) {
    return gamma / 4.f;
  } else if (gamma < 1.f) {
    return Powf((gamma + 0.111572195921731f) / 1.111572195921731f, 1.f / 0.45f);
  }
  return 1.f;
}